

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

void __thiscall HighFreqDataType::HighFreqDataType(HighFreqDataType *this,HighFreqDataType *obj)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType =
       (_func_int **)&PTR__HighFreqDataType_002fa610;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  (this->origin)._M_dataplus._M_p = (pointer)&(this->origin).field_2;
  (this->origin)._M_string_length = 0;
  (this->origin).field_2._M_local_buf[0] = '\0';
  (this->dataFormat)._M_dataplus._M_p = (pointer)&(this->dataFormat).field_2;
  (this->dataFormat)._M_string_length = 0;
  (this->dataFormat).field_2._M_local_buf[0] = '\0';
  (this->sockAddr)._M_dataplus._M_p = (pointer)&(this->sockAddr).field_2;
  (this->sockAddr)._M_string_length = 0;
  (this->sockAddr).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  std::__cxx11::string::_M_assign((string *)&this->origin);
  std::__cxx11::string::_M_assign((string *)&this->dataFormat);
  std::__cxx11::string::_M_assign((string *)&this->sockAddr);
  this->byteSize = obj->byteSize;
  return;
}

Assistant:

HighFreqDataType::HighFreqDataType(const HighFreqDataType &obj) {
    name = obj.name;
    origin = obj.origin;
    dataFormat = obj.dataFormat;
    sockAddr = obj.sockAddr;
    byteSize = obj.byteSize;
}